

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdAuto.c
# Opt level: O1

Vec_Ptr_t * Cmd_ReadFiles(char *pFileList)

{
  uint uVar1;
  uint uVar2;
  FILE *pFVar3;
  FILE *__stream;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  char *pcVar6;
  size_t sVar7;
  Gia_Man_t *pGVar8;
  ulong uVar9;
  int iVar10;
  char pBuffer [1000];
  undefined8 local_420;
  byte local_418 [1000];
  
  __stream = fopen(pFileList,"rb");
  if (__stream == (FILE *)0x0) {
    pVVar4 = (Vec_Ptr_t *)0x0;
    printf("File containing list of files \"%s\" cannot be opened.\n",pFileList);
  }
  else {
    pVVar4 = (Vec_Ptr_t *)malloc(0x10);
    pVVar4->nCap = 100;
    pVVar4->nSize = 0;
    ppvVar5 = (void **)malloc(800);
    pVVar4->pArray = ppvVar5;
    pcVar6 = fgets((char *)local_418,1000,__stream);
    pFVar3 = __stream;
    while (pcVar6 != (char *)0x0) {
      local_420 = pFVar3;
      if ((local_418[0] != 0x23) &&
         ((local_418[0] < 0x21 & (byte)(0x100002600 >> (local_418[0] & 0x3f))) == 0)) {
        while( true ) {
          sVar7 = strlen((char *)local_418);
          uVar9 = (ulong)local_418[sVar7 - 1];
          if ((0x20 < uVar9) || ((0x100002600U >> (uVar9 & 0x3f) & 1) == 0)) break;
          local_418[sVar7 - 1] = 0;
        }
        pGVar8 = Gia_AigerRead((char *)local_418,0,0,0);
        if (pGVar8 == (Gia_Man_t *)0x0) {
          printf("Cannot read AIG from file \"%s\".\n",local_418);
        }
        else {
          uVar1 = pVVar4->nSize;
          uVar2 = pVVar4->nCap;
          if (uVar1 == uVar2) {
            if ((int)uVar2 < 0x10) {
              if (pVVar4->pArray == (void **)0x0) {
                ppvVar5 = (void **)malloc(0x80);
              }
              else {
                ppvVar5 = (void **)realloc(pVVar4->pArray,0x80);
              }
              iVar10 = 0x10;
            }
            else {
              iVar10 = uVar2 * 2;
              if (iVar10 <= (int)uVar2) goto LAB_00323411;
              if (pVVar4->pArray == (void **)0x0) {
                ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
              }
              else {
                ppvVar5 = (void **)realloc(pVVar4->pArray,(ulong)uVar2 << 4);
              }
            }
            pVVar4->pArray = ppvVar5;
            pVVar4->nCap = iVar10;
          }
LAB_00323411:
          pVVar4->nSize = uVar1 + 1;
          pVVar4->pArray[(int)uVar1] = pGVar8;
          __stream = local_420;
        }
      }
      pcVar6 = fgets((char *)local_418,1000,__stream);
      pFVar3 = local_420;
    }
    fclose(__stream);
  }
  return pVVar4;
}

Assistant:

Vec_Ptr_t * Cmd_ReadFiles( char * pFileList )
{
    Gia_Man_t * pGia;
    Vec_Ptr_t * vAigs;
    char pBuffer[CMD_AUTO_LINE_MAX];
    FILE * pFile = fopen( pFileList, "rb" );
    if ( pFile == NULL )
        { printf( "File containing list of files \"%s\" cannot be opened.\n", pFileList ); return NULL; }
    vAigs = Vec_PtrAlloc( 100 );
    while ( fgets( pBuffer, CMD_AUTO_LINE_MAX, pFile ) != NULL )
    {
        // get the command from the file
        if ( Cmf_IsSpace(pBuffer[0]) || pBuffer[0] == '#')
            continue;
        // skip trailing spaces
        while ( Cmf_IsSpace(pBuffer[strlen(pBuffer)-1]) )
            pBuffer[strlen(pBuffer)-1] = 0;
        // read the file
        pGia = Gia_AigerRead( pBuffer, 0, 0, 0 );
        if ( pGia == NULL )
        {
            printf( "Cannot read AIG from file \"%s\".\n", pBuffer );
            continue;
        }
        Vec_PtrPush( vAigs, pGia );
    }
    fclose( pFile );
    return vAigs;
}